

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::CheckCMP0004(string *__return_storage_ptr__,cmGeneratorTarget *this,string *item)

{
  bool bVar1;
  PolicyStatus PVar2;
  cmake *this_00;
  ostream *poVar3;
  string *psVar4;
  PolicyID id;
  PolicyID id_00;
  undefined1 local_5c0 [16];
  string local_5b0;
  string local_590;
  undefined1 local_570 [8];
  ostringstream e_1;
  undefined1 local_3f8 [16];
  string local_3e8;
  undefined1 local_3c8 [8];
  ostringstream e;
  undefined1 local_250 [16];
  string local_240;
  string local_220;
  undefined1 local_200 [8];
  ostringstream w;
  cmake *cm;
  string local_50 [32];
  long local_30;
  size_type pos;
  _Base_ptr local_20;
  string *item_local;
  cmGeneratorTarget *this_local;
  string *lib;
  
  pos._7_1_ = 0;
  local_20 = (_Base_ptr)item;
  item_local = (string *)this;
  this_local = (cmGeneratorTarget *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)item);
  local_30 = std::__cxx11::string::find_first_not_of((char *)__return_storage_ptr__,0xc4d3c8);
  if (local_30 != -1) {
    std::__cxx11::string::substr((ulong)local_50,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_50);
    std::__cxx11::string::~string(local_50);
  }
  local_30 = std::__cxx11::string::find_last_not_of((char *)__return_storage_ptr__,0xc4d3c8);
  if (local_30 != -1) {
    std::__cxx11::string::substr((ulong)&cm,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&cm);
    std::__cxx11::string::~string((string *)&cm);
  }
  bVar1 = std::operator!=(__return_storage_ptr__,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_20);
  if (bVar1) {
    this_00 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
    PVar2 = GetPolicyStatusCMP0004(this);
    switch(PVar2) {
    case WARN:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_220,(cmPolicies *)0x4,id);
      poVar3 = std::operator<<((ostream *)local_200,(string *)&local_220);
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"Target \"");
      psVar4 = GetName_abi_cxx11_(this);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      poVar3 = std::operator<<(poVar3,"\" links to item \"");
      poVar3 = std::operator<<(poVar3,(string *)local_20);
      std::operator<<(poVar3,"\" which has leading or trailing whitespace.");
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::ostringstream::str();
      GetBacktrace((cmGeneratorTarget *)local_250);
      cmake::IssueMessage(this_00,AUTHOR_WARNING,(string *)(local_250 + 0x10),
                          (cmListFileBacktrace *)local_250);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_250);
      std::__cxx11::string::~string((string *)(local_250 + 0x10));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
    case OLD:
      break;
    case NEW:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3c8);
      poVar3 = std::operator<<((ostream *)local_3c8,"Target \"");
      psVar4 = GetName_abi_cxx11_(this);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      poVar3 = std::operator<<(poVar3,"\" links to item \"");
      poVar3 = std::operator<<(poVar3,(string *)local_20);
      poVar3 = std::operator<<(poVar3,"\" which has leading or trailing whitespace.  ");
      std::operator<<(poVar3,"This is now an error according to policy CMP0004.");
      std::__cxx11::ostringstream::str();
      GetBacktrace((cmGeneratorTarget *)local_3f8);
      cmake::IssueMessage(this_00,FATAL_ERROR,(string *)(local_3f8 + 0x10),
                          (cmListFileBacktrace *)local_3f8);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_3f8);
      std::__cxx11::string::~string((string *)(local_3f8 + 0x10));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3c8);
      break;
    case REQUIRED_IF_USED:
    case REQUIRED_ALWAYS:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_570);
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_590,(cmPolicies *)0x4,id_00);
      poVar3 = std::operator<<((ostream *)local_570,(string *)&local_590);
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"Target \"");
      psVar4 = GetName_abi_cxx11_(this);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      poVar3 = std::operator<<(poVar3,"\" links to item \"");
      poVar3 = std::operator<<(poVar3,(string *)local_20);
      std::operator<<(poVar3,"\" which has leading or trailing whitespace.");
      std::__cxx11::string::~string((string *)&local_590);
      std::__cxx11::ostringstream::str();
      GetBacktrace((cmGeneratorTarget *)local_5c0);
      cmake::IssueMessage(this_00,FATAL_ERROR,(string *)(local_5c0 + 0x10),
                          (cmListFileBacktrace *)local_5c0);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_5c0);
      std::__cxx11::string::~string((string *)(local_5c0 + 0x10));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_570);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::CheckCMP0004(std::string const& item) const
{
  // Strip whitespace off the library names because we used to do this
  // in case variables were expanded at generate time.  We no longer
  // do the expansion but users link to libraries like " ${VAR} ".
  std::string lib = item;
  std::string::size_type pos = lib.find_first_not_of(" \t\r\n");
  if (pos != std::string::npos) {
    lib = lib.substr(pos);
  }
  pos = lib.find_last_not_of(" \t\r\n");
  if (pos != std::string::npos) {
    lib = lib.substr(0, pos + 1);
  }
  if (lib != item) {
    cmake* cm = this->LocalGenerator->GetCMakeInstance();
    switch (this->GetPolicyStatusCMP0004()) {
      case cmPolicies::WARN: {
        std::ostringstream w;
        w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0004) << "\n"
          << "Target \"" << this->GetName() << "\" links to item \"" << item
          << "\" which has leading or trailing whitespace.";
        cm->IssueMessage(MessageType::AUTHOR_WARNING, w.str(),
                         this->GetBacktrace());
      }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        break;
      case cmPolicies::NEW: {
        std::ostringstream e;
        e << "Target \"" << this->GetName() << "\" links to item \"" << item
          << "\" which has leading or trailing whitespace.  "
          << "This is now an error according to policy CMP0004.";
        cm->IssueMessage(MessageType::FATAL_ERROR, e.str(),
                         this->GetBacktrace());
      } break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS: {
        std::ostringstream e;
        e << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0004) << "\n"
          << "Target \"" << this->GetName() << "\" links to item \"" << item
          << "\" which has leading or trailing whitespace.";
        cm->IssueMessage(MessageType::FATAL_ERROR, e.str(),
                         this->GetBacktrace());
      } break;
    }
  }
  return lib;
}